

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BamToolsIndex::CloseFile(BamToolsIndex *this)

{
  bool bVar1;
  long in_RDI;
  BamToolsIndex *in_stack_ffffffffffffffe8;
  
  bVar1 = IsDeviceOpen(in_stack_ffffffffffffffe8);
  if (bVar1) {
    (**(code **)(**(long **)(in_RDI + 0x60) + 0x10))();
    if (*(long **)(in_RDI + 0x60) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x60) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x60) = 0;
  }
  std::
  vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
  ::clear((vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
           *)0x1c3855);
  return;
}

Assistant:

void BamToolsIndex::CloseFile(void) {
    if ( IsDeviceOpen() ) {
        m_resources.Device->Close();
        delete m_resources.Device;
        m_resources.Device = 0;
    }
    m_indexFileSummary.clear();
}